

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

string * glcts::anon_unknown_0::ShaderSourceFactory::generateComputeShader
                   (string *__return_storage_ptr__,ShaderKey *param_1,
                   vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   *uniforms,
                   vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                   *subroutineUniforms,string *additionalDef,ContextType type)

{
  ostream *poVar1;
  undefined1 local_1b0 [8];
  ostringstream ret;
  string *additionalDef_local;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *subroutineUniforms_local;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  *uniforms_local;
  ShaderKey *param_0_local;
  ContextType type_local;
  
  ret._368_8_ = additionalDef;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  streamShaderHeader((ostringstream *)local_1b0,type);
  poVar1 = std::operator<<((ostream *)local_1b0,"\nlayout (local_size_x = 1, local_size_y = 1) in;")
  ;
  poVar1 = std::operator<<(poVar1,"\nlayout (std430, binding = 1) buffer ResultBuffer {");
  poVar1 = std::operator<<(poVar1,"\n    vec4 cs_ValidationResult;");
  poVar1 = std::operator<<(poVar1,"\n};");
  std::operator<<(poVar1,"\n");
  streamUniformDefinitions(uniforms,0x91b9,(ostringstream *)local_1b0);
  std::operator<<((ostream *)local_1b0,"\n");
  streamSubroutineDefinitions(subroutineUniforms,0x91b9,(ostringstream *)local_1b0);
  poVar1 = std::operator<<((ostream *)local_1b0,"\n");
  poVar1 = std::operator<<(poVar1,(string *)ret._368_8_);
  poVar1 = std::operator<<(poVar1,"\nvoid main() {");
  poVar1 = std::operator<<(poVar1,"\n    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);");
  std::operator<<(poVar1,"\n");
  streamUniformValidators((ostringstream *)local_1b0,uniforms,0x91b9,"validationResult");
  std::operator<<((ostream *)local_1b0,"\n");
  streamSubroutineValidators
            ((ostringstream *)local_1b0,subroutineUniforms,0x91b9,"validationResult");
  poVar1 = std::operator<<((ostream *)local_1b0,"\n    cs_ValidationResult =  validationResult;");
  std::operator<<(poVar1,"\n}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateComputeShader(const ShaderKey&, const std::vector<Uniform>& uniforms,
											 const std::vector<SubroutineUniform>& subroutineUniforms,
											 const std::string& additionalDef, const glu::ContextType type)
	{

		std::ostringstream ret;
		streamShaderHeader(ret, type);
		ret << NL "layout (local_size_x = 1, local_size_y = 1) in;"
			<< NL "layout (std430, binding = 1) buffer ResultBuffer {" << NL "    vec4 cs_ValidationResult;" << NL "};"
			<< NL;
		streamUniformDefinitions(uniforms, GL_COMPUTE_SHADER, ret);
		ret << NL;
		streamSubroutineDefinitions(subroutineUniforms, GL_COMPUTE_SHADER, ret);
		ret << NL << additionalDef << NL "void main() {" << NL "    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);"
			<< NL;
		streamUniformValidators(ret, uniforms, GL_COMPUTE_SHADER, "validationResult");
		ret << NL;
		streamSubroutineValidators(ret, subroutineUniforms, GL_COMPUTE_SHADER, "validationResult");
		ret << NL "    cs_ValidationResult =  validationResult;" << NL "}";
		return ret.str();
	}